

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  ulong uVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  lua_Integer lVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  ulong unaff_RBP;
  lua_Integer n;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  size_t lp;
  size_t ls;
  MatchState ms;
  ulong local_280;
  int local_274;
  char *local_270;
  char *local_268;
  ulong local_260;
  MatchState local_258;
  
  local_274 = find;
  local_270 = luaL_checklstring(L,1,&local_260);
  local_268 = luaL_checklstring(L,2,&local_280);
  lVar5 = luaL_optinteger(L,3,1);
  n = lVar5;
  if ((lVar5 < 1) &&
     (n = 1, SBORROW8(lVar5,-local_260) == (long)(lVar5 + local_260) < 0 && lVar5 != 0)) {
    n = lVar5 + local_260 + 1;
  }
  uVar1 = n - 1;
  if (uVar1 <= local_260) {
    if (local_274 == 0) {
LAB_00120711:
      pcVar6 = local_270;
      cVar2 = *local_268;
      pcVar9 = local_268;
      if (cVar2 == '^') {
        pcVar9 = local_268 + 1;
        local_280 = local_280 - 1;
      }
      local_258.matchdepth = 200;
      local_258.src_init = local_270;
      local_258.src_end = local_270 + local_260;
      local_258.p_end = pcVar9 + local_280;
      local_258.L = L;
      do {
        pcVar7 = pcVar6 + n + -1;
        local_258.level = '\0';
        pcVar11 = match(&local_258,pcVar7,pcVar9);
        if (pcVar11 != (char *)0x0) {
          if (local_274 == 0) {
            uVar4 = push_captures(&local_258,pcVar7,pcVar11);
            unaff_RBP = (ulong)uVar4;
          }
          else {
            lua_pushinteger(L,n);
            lua_pushinteger(L,(long)pcVar11 - (long)local_270);
            iVar3 = push_captures(&local_258,(char *)0x0,(char *)0x0);
            unaff_RBP = (ulong)(iVar3 + 2);
          }
        }
        if (pcVar11 != (char *)0x0) {
          return (int)unaff_RBP;
        }
      } while ((cVar2 != '^') && (n = n + 1, pcVar7 < local_258.src_end));
    }
    else {
      iVar3 = lua_toboolean(L,4);
      unaff_RBP = local_280;
      if (iVar3 == 0) {
        uVar8 = 0;
        do {
          pcVar6 = local_268 + uVar8;
          pcVar9 = strpbrk(pcVar6,"^$*+?.([%-");
          if (pcVar9 != (char *)0x0) goto LAB_00120711;
          sVar10 = strlen(pcVar6);
          uVar8 = uVar8 + sVar10 + 1;
        } while (uVar8 <= unaff_RBP);
      }
      pcVar6 = local_270 + uVar1;
      if (local_280 != 0) {
        if (local_280 <= local_260 - uVar1) {
          sVar10 = local_280 - 1;
          pcVar9 = (char *)((local_260 - uVar1) - sVar10);
          if (pcVar9 != (char *)0x0) {
            cVar2 = *local_268;
            pcVar11 = local_268 + 1;
            pcVar7 = pcVar6;
            do {
              pcVar6 = (char *)memchr(pcVar7,(int)cVar2,(size_t)pcVar9);
              if (pcVar6 == (char *)0x0) break;
              __s1 = pcVar6 + 1;
              iVar3 = bcmp(__s1,pcVar11,sVar10);
              if (iVar3 == 0) goto LAB_00120695;
              pcVar9 = pcVar7 + ((long)pcVar9 - (long)__s1);
              pcVar7 = __s1;
            } while (pcVar9 != (char *)0x0);
          }
        }
        pcVar6 = (char *)0x0;
      }
LAB_00120695:
      pcVar9 = local_270;
      if (pcVar6 != (char *)0x0) {
        lua_pushinteger(L,(lua_Integer)(pcVar6 + (1 - (long)local_270)));
        lua_pushinteger(L,(lua_Integer)(pcVar6 + (local_280 - (long)pcVar9)));
        return 2;
      }
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int str_find_aux (lua_State *L, int find) {
  size_t ls, lp;
  const char *s = luaL_checklstring(L, 1, &ls);
  const char *p = luaL_checklstring(L, 2, &lp);
  size_t init = posrelatI(luaL_optinteger(L, 3, 1), ls) - 1;
  if (init > ls) {  /* start after string's end? */
    luaL_pushfail(L);  /* cannot find anything */
    return 1;
  }
  /* explicit request or no special characters? */
  if (find && (lua_toboolean(L, 4) || nospecials(p, lp))) {
    /* do a plain search */
    const char *s2 = lmemfind(s + init, ls - init, p, lp);
    if (s2) {
      lua_pushinteger(L, (s2 - s) + 1);
      lua_pushinteger(L, (s2 - s) + lp);
      return 2;
    }
  }
  else {
    MatchState ms;
    const char *s1 = s + init;
    int anchor = (*p == '^');
    if (anchor) {
      p++; lp--;  /* skip anchor character */
    }
    prepstate(&ms, L, s, ls, p, lp);
    do {
      const char *res;
      reprepstate(&ms);
      if ((res=match(&ms, s1, p)) != NULL) {
        if (find) {
          lua_pushinteger(L, (s1 - s) + 1);  /* start */
          lua_pushinteger(L, res - s);   /* end */
          return push_captures(&ms, NULL, 0) + 2;
        }
        else
          return push_captures(&ms, s1, res);
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  luaL_pushfail(L);  /* not found */
  return 1;
}